

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O3

void h265e_dpb_proc_cpb(H265eDpb *dpb,EncCpbStatus *cpb)

{
  long lVar1;
  H265eDpbFrm *pHVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  RK_U32 *pRVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  EncFrmStatus *pEVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  if (cpb != (EncCpbStatus *)0x0 && dpb != (H265eDpb *)0x0) {
    if (((ulong)cpb->curr & 0x20) == 0) {
      bVar5 = true;
      uVar8 = 0;
      do {
        while (uVar9 = cpb->init[uVar8].val, (uVar9 & 1) == 0) {
LAB_001ca765:
          uVar8 = uVar8 + 1;
          if (uVar8 == 8) {
            if (bVar5) goto LAB_001ca880;
            goto LAB_001ca7f8;
          }
        }
        if ((uVar9 & 0x40) != 0) {
          _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!frm->is_non_ref",
                     "h265e_dpb_proc_cpb",0x30c);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001ca8f5:
            abort();
          }
          uVar9 = cpb->init[uVar8].val;
        }
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",(char *)0x0,
                     uVar8 & 0xffffffff,uVar9 >> 0x30,(uint)uVar9 & 1,(uint)(uVar9 >> 6) & 1,
                     (uint)uVar9 >> 7 & 1);
          uVar9 = cpb->init[uVar8].val;
        }
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","frm %d start finding slot \n",(char *)0x0,uVar9 >> 0x30);
        }
        lVar7 = 0;
        pEVar10 = &dpb->frame_list[0].status;
        while (((*(int *)((long)pEVar10 + 0xc) == 0 || ((pEVar10->val & 1) == 0)) ||
               ((short)(pEVar10->val >> 0x30) != (short)(uVar9 >> 0x30)))) {
          lVar7 = lVar7 + 1;
          pEVar10 = pEVar10 + 0xc;
          if (lVar7 == 0x10) {
            h265e_dpb_proc_cpb_cold_1();
            goto LAB_001ca8f5;
          }
        }
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","frm %d match slot %d valid %d\n",(char *)0x0,uVar9 >> 0x30,lVar7
                     ,1);
        }
        if ((char)*(ushort *)(pEVar10 + 1) != '\0') goto LAB_001ca765;
        *(ushort *)(pEVar10 + 1) = *(ushort *)(pEVar10 + 1) | 1;
        *pEVar10 = cpb->init[uVar8];
        *(undefined4 *)(pEVar10[4].val + 0x678) = 1;
        uVar8 = uVar8 + 1;
        bVar5 = false;
      } while (uVar8 != 8);
LAB_001ca7f8:
      if (((byte)h265e_debug & 0x80) != 0) {
        _mpp_log_l(4,"h265e_dpb","cpb roll back found",(char *)0x0);
      }
      uVar11 = 0;
      uVar12 = 0;
      lVar7 = 0x3c0;
      do {
        if (*(char *)((long)(dpb->RpsList).poc + lVar7 + -0x44) != '\0') {
          lVar1 = *(long *)((long)(dpb->RpsList).poc + lVar7 + -0x2c);
          uVar3 = *(uint *)(lVar1 + 0x10);
          uVar4 = *(uint *)(lVar1 + 0x14);
          uVar13 = -(uint)((int)uVar3 < (int)uVar11);
          uVar14 = -(uint)((int)uVar4 < (int)uVar12);
          uVar11 = uVar11 & uVar13 | ~uVar13 & uVar3;
          uVar12 = uVar12 & uVar14 | ~uVar14 & uVar4;
        }
        lVar7 = lVar7 + 0x60;
      } while (lVar7 != 0xa20);
      pHVar2 = dpb->curr;
      if (pHVar2->inited != 0) {
        pHVar2->slice->is_referenced = 0;
        pHVar2->is_long_term = 0;
        pHVar2->used_by_cur = 0;
        *(undefined1 *)&pHVar2->field_7 = 0;
        (pHVar2->status).val = 0;
      }
      dpb->seq_idx = uVar11;
      dpb->gop_idx = uVar12;
LAB_001ca880:
      pRVar6 = &dpb->frame_list[0].inited;
      uVar8 = 0;
      do {
        if ((*pRVar6 != 0) && (*(char *)(pRVar6 + -1) == '\0')) {
          if (((byte)h265e_debug & 0x80) != 0) {
            _mpp_log_l(4,"h265e_dpb","reset index %d frame->inited %d rame->on_used %x",(char *)0x0,
                       uVar8 & 0xffffffff,(ulong)*pRVar6,
                       ((anon_union_4_2_f1ea2294_for_H265eDpbFrm_t_7 *)(pRVar6 + -1))->on_used);
          }
          ((EncFrmStatus *)(pRVar6 + -3))->val = 0;
        }
        uVar8 = uVar8 + 1;
        pRVar6 = pRVar6 + 0x18;
      } while (uVar8 != 0x11);
    }
    else {
      lVar7 = 0;
      do {
        if (*(int *)((long)&dpb->frame_list[0].inited + lVar7) != 0) {
          *(undefined4 *)(*(long *)((long)&dpb->frame_list[0].slice + lVar7) + 0x678) = 0;
          *(undefined8 *)((long)&dpb->frame_list[0].is_long_term + lVar7) = 0;
          *(undefined1 *)((long)&dpb->frame_list[0].field_7 + lVar7) = 0;
          *(undefined8 *)((long)&dpb->frame_list[0].status + lVar7) = 0;
        }
        lVar7 = lVar7 + 0x60;
      } while (lVar7 != 0x660);
    }
  }
  return;
}

Assistant:

void h265e_dpb_proc_cpb(H265eDpb *dpb, EncCpbStatus *cpb)
{
    EncFrmStatus *curr = &cpb->curr;
    RK_U32 index = 0, i = 0;
    H265eDpbFrm *p = NULL;
    RK_U32 need_rebuild = 0;
    RK_S32 max_gop_id = 0, max_poc = 0;

    if (!dpb || !cpb)
        return;

    if (curr->is_idr) {
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];
            if (frame->inited) {
                frame->slice->is_referenced = 0;
                frame->is_long_term = 0;
                frame->used_by_cur = 0;
                frame->dpb_used = 0;
                frame->status.val = 0;
            }
        }
        return;
    }

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h265e_dbg_dpb("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                      i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        p = h265e_find_cpb_in_dpb(dpb->frame_list, MAX_REFS, frm);
        if (!p->dpb_used) {
            p->dpb_used = 1;
            p->status.val = frm->val;
            p->slice->is_referenced = 1;
            need_rebuild = 1;
        }
    }

    if (need_rebuild) {
        h265e_dbg_dpb("cpb roll back found");
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];

            if (frame->dpb_used) {
                if (max_poc < frame->slice->poc) {
                    max_poc = frame->slice->poc;
                }
                if (max_gop_id < frame->slice->gop_idx) {
                    max_gop_id = frame->slice->gop_idx;
                }
            }
        }

        H265eDpbFrm *frame = dpb->curr;

        if (frame->inited) {
            frame->slice->is_referenced = 0;
            frame->is_long_term = 0;
            frame->used_by_cur = 0;
            frame->dpb_used = 0;
            frame->status.val = 0;
        }
        dpb->seq_idx = max_poc;
        dpb->gop_idx = max_gop_id;
    }

    for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
        H265eDpbFrm *frame = &dpb->frame_list[index];

        if (frame->inited && !frame->dpb_used) {
            h265e_dbg_dpb("reset index %d frame->inited %d rame->on_used %x",
                          index, frame->inited, frame->on_used);
            frame->status.val = 0;
        }
    }
}